

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_ModelComponent::SetModelSerialNumber
          (ON_ModelComponent *this,uint model_serial_number,uint reference_model_serial_number,
          uint instance_definition_model_serial_number)

{
  if ((this->m_locked_status & 4) == 0) {
    this->m_model_serial_number = model_serial_number;
    this->m_reference_model_serial_number = reference_model_serial_number;
    this->m_linked_idef_serial_number = instance_definition_model_serial_number;
    *(byte *)&this->m_set_status = (byte)this->m_set_status | 4;
  }
  return (this->m_locked_status & 4) == 0;
}

Assistant:

bool ON_ModelComponent::SetModelSerialNumber(
  unsigned int model_serial_number,
  unsigned int reference_model_serial_number,
  unsigned int instance_definition_model_serial_number
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::ModelSerialNumberAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  m_model_serial_number = model_serial_number;
  m_reference_model_serial_number = reference_model_serial_number;
  m_linked_idef_serial_number = instance_definition_model_serial_number;
  m_set_status |= bit;
  return true;

}